

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<unsigned_int,unsigned_int,unsigned_int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,
          function<unsigned_int_(unsigned_int,_unsigned_int)> *f)

{
  function<unsigned_int_(unsigned_int,_unsigned_int)> *method;
  function<unsigned_int_(unsigned_int,_unsigned_int)> local_38;
  jsonrpccxx *local_18;
  function<unsigned_int_(unsigned_int,_unsigned_int)> *f_local;
  
  local_18 = this;
  f_local = (function<unsigned_int_(unsigned_int,_unsigned_int)> *)__return_storage_ptr__;
  std::function<unsigned_int_(unsigned_int,_unsigned_int)>::function
            (&local_38,(function<unsigned_int_(unsigned_int,_unsigned_int)> *)this);
  methodHandle<unsigned_int,unsigned_int,unsigned_int>
            (__return_storage_ptr__,(jsonrpccxx *)&local_38,method);
  std::function<unsigned_int_(unsigned_int,_unsigned_int)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(std::function<ReturnType(ParamTypes...)> f) {
    return methodHandle(f);
  }